

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcwrite.c
# Opt level: O1

void bcwrite_proto(BCWriteCtx *ctx,GCproto *pt)

{
  double dVar1;
  byte bVar2;
  char cVar3;
  uint uVar4;
  ulong uVar5;
  char *pcVar6;
  uint *puVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  MSize MVar13;
  GCproto *pt_00;
  MSize i;
  uint32_t uVar14;
  uint uVar15;
  long lVar16;
  cTValue *pcVar17;
  uint local_4c;
  
  if (((pt->flags & 1) != 0) && (uVar15 = pt->sizekgc, (ulong)uVar15 != 0)) {
    uVar8 = (pt->k).ptr32;
    lVar16 = 0;
    do {
      pt_00 = (GCproto *)(ulong)*(uint *)(((ulong)uVar8 - 4) + lVar16 * 4);
      if (pt_00->gct == '\a') {
        bcwrite_proto(ctx,pt_00);
      }
      lVar16 = lVar16 + -1;
    } while (-lVar16 != (ulong)uVar15);
  }
  MVar13 = (uint)pt->sizeuv * 2 + pt->sizebc * 4 + 0x23;
  uVar15 = (ctx->sb).b.ptr32;
  pcVar6 = (char *)(ulong)uVar15;
  if ((ctx->sb).e.ptr32 - uVar15 < MVar13) {
    pcVar6 = lj_buf_need2(&ctx->sb,MVar13);
  }
  pcVar6[5] = pt->flags & 7;
  pcVar6[6] = pt->numparams;
  pcVar6[7] = pt->framesize;
  pcVar6[8] = pt->sizeuv;
  pcVar6 = lj_strfmt_wuleb128(pcVar6 + 9,pt->sizekgc);
  pcVar6 = lj_strfmt_wuleb128(pcVar6,pt->sizekn);
  pcVar6 = lj_strfmt_wuleb128(pcVar6,pt->sizebc - 1);
  if (ctx->strip == 0) {
    uVar14 = (pt->lineinfo).ptr32;
    local_4c = 0;
    if (uVar14 != 0) {
      local_4c = ((int)pt - uVar14) + pt->sizept;
    }
    pcVar6 = lj_strfmt_wuleb128(pcVar6,local_4c);
    if (local_4c == 0) goto LAB_00128cc6;
    pcVar6 = lj_strfmt_wuleb128(pcVar6,pt->firstline);
    pcVar6 = lj_strfmt_wuleb128(pcVar6,pt->numline);
  }
  else {
LAB_00128cc6:
    local_4c = 0;
  }
  MVar13 = pt->sizebc;
  uVar10 = (ulong)(MVar13 * 4 - 4);
  memcpy(pcVar6,&pt[1].marked,uVar10);
  if ((pt->flags & 0x10) == 0) {
    if (MVar13 == 1 || pt->trace == 0) goto LAB_00128dac;
  }
  else if (MVar13 == 1) goto LAB_00128dac;
  uVar15 = *(uint *)((ulong)(ctx->sb).L.ptr32 + 8);
  lVar16 = 0;
  do {
    uVar8 = (byte)pcVar6[lVar16 * 4] - 0x4e;
    if (uVar8 < 10) {
      if ((0x125U >> (uVar8 & 0x1f) & 1) == 0) {
        if ((0x248U >> (uVar8 & 0x1f) & 1) != 0) {
          *(undefined4 *)(pcVar6 + lVar16 * 4) =
               *(undefined4 *)
                ((ulong)*(uint *)(*(long *)((ulong)uVar15 + 0x3b8) +
                                 (ulong)*(ushort *)(pcVar6 + lVar16 * 4 + 2) * 4) + 0x38);
        }
      }
      else {
        pcVar6[lVar16 * 4] = pcVar6[lVar16 * 4] - 1;
      }
    }
    lVar16 = lVar16 + 1;
  } while (MVar13 - 1 != (int)lVar16);
LAB_00128dac:
  bVar2 = pt->sizeuv;
  memcpy(pcVar6 + uVar10,(void *)(ulong)(pt->uv).ptr32,(ulong)((uint)bVar2 + (uint)bVar2));
  (ctx->sb).p.ptr32 = (int)(pcVar6 + uVar10) + (uint)bVar2 * 2;
  uVar15 = pt->sizekgc;
  if ((ulong)uVar15 != 0) {
    puVar7 = (uint *)((ulong)(pt->k).ptr32 + (ulong)uVar15 * -4);
    uVar8 = 0;
    do {
      uVar10 = (ulong)*puVar7;
      cVar3 = *(char *)(uVar10 + 5);
      if (cVar3 == '\n') {
        MVar13 = 0x15;
        if (*(short *)(uVar10 + 6) == 0xb) {
          uVar11 = 2;
        }
        else if (*(short *)(uVar10 + 6) == 0xc) {
          uVar11 = 3;
        }
        else {
          uVar11 = 4;
        }
      }
      else {
        uVar11 = 0;
        MVar13 = 1;
        if (cVar3 != '\a') {
          if (cVar3 == '\x04') {
            uVar11 = *(int *)(uVar10 + 0xc) + 5;
            MVar13 = uVar11;
          }
          else {
            MVar13 = 0xb;
            uVar11 = 1;
          }
        }
      }
      uVar4 = (ctx->sb).p.ptr32;
      pcVar6 = (char *)(ulong)uVar4;
      if ((ctx->sb).e.ptr32 - uVar4 < MVar13) {
        pcVar6 = lj_buf_more2(&ctx->sb,MVar13);
      }
      pcVar6 = lj_strfmt_wuleb128(pcVar6,uVar11);
      if (uVar11 < 5) {
        if (uVar11 == 0) goto LAB_00128f08;
        if (uVar11 != 1) {
          pcVar6 = lj_strfmt_wuleb128(pcVar6,*(uint32_t *)(uVar10 + 8));
          pcVar6 = lj_strfmt_wuleb128(pcVar6,*(uint32_t *)(uVar10 + 0xc));
          if (uVar11 == 4) {
            pcVar6 = lj_strfmt_wuleb128(pcVar6,*(uint32_t *)(uVar10 + 0x10));
            pcVar6 = lj_strfmt_wuleb128(pcVar6,*(uint32_t *)(uVar10 + 0x14));
          }
          goto LAB_00128f08;
        }
        uVar14 = 0;
        uVar12 = 0;
        if ((ulong)*(uint *)(uVar10 + 0x18) != 0) {
          uVar5 = (ulong)*(uint *)(uVar10 + 0x18);
          do {
            uVar12 = uVar5;
            if ((long)uVar12 < 1) {
              uVar12 = 0;
              break;
            }
            uVar5 = uVar12 - 1;
          } while (*(int *)(((ulong)*(uint *)(uVar10 + 8) - 4) + uVar12 * 8) == -1);
        }
        iVar9 = *(int *)(uVar10 + 0x1c);
        if (iVar9 != 0) {
          lVar16 = 0;
          uVar14 = 0;
          do {
            uVar14 = uVar14 + (*(int *)((ulong)*(uint *)(uVar10 + 0x14) + 4 + lVar16) != -1);
            lVar16 = lVar16 + 0x18;
          } while ((ulong)(iVar9 + 1 + (uint)(iVar9 == -1)) * 0x18 != lVar16);
        }
        pcVar6 = lj_strfmt_wuleb128(pcVar6,(uint32_t)uVar12);
        pcVar6 = lj_strfmt_wuleb128(pcVar6,uVar14);
        (ctx->sb).p.ptr32 = (uint32_t)pcVar6;
        if ((uint32_t)uVar12 != 0) {
          pcVar17 = (cTValue *)(ulong)*(uint *)(uVar10 + 8);
          do {
            bcwrite_ktabk(ctx,pcVar17,1);
            pcVar17 = pcVar17 + 1;
            uVar11 = (int)uVar12 - 1;
            uVar12 = (ulong)uVar11;
          } while (uVar11 != 0);
        }
        if (uVar14 != 0) {
          pcVar17 = (cTValue *)
                    ((ulong)*(uint *)(uVar10 + 0x14) + (ulong)*(uint *)(uVar10 + 0x1c) * 0x18 + 8);
          do {
            if (*(int *)((long)pcVar17 + -4) != -1) {
              bcwrite_ktabk(ctx,pcVar17,0);
              bcwrite_ktabk(ctx,pcVar17 + -1,1);
              uVar14 = uVar14 - 1;
              if (uVar14 == 0) break;
            }
            pcVar17 = pcVar17 + -3;
          } while( true );
        }
      }
      else {
        uVar11 = *(uint *)(uVar10 + 0xc);
        memcpy(pcVar6,(void *)(uVar10 + 0x10),(ulong)uVar11);
        pcVar6 = pcVar6 + uVar11;
LAB_00128f08:
        (ctx->sb).p.ptr32 = (uint32_t)pcVar6;
      }
      uVar8 = uVar8 + 1;
      puVar7 = puVar7 + 1;
    } while (uVar8 != uVar15);
  }
  uVar10 = (ulong)(pt->k).ptr32;
  MVar13 = pt->sizekn;
  uVar15 = (ctx->sb).p.ptr32;
  pcVar6 = (char *)(ulong)uVar15;
  if ((ctx->sb).e.ptr32 - uVar15 < MVar13 * 10) {
    pcVar6 = lj_buf_more2(&ctx->sb,MVar13 * 10);
  }
  if (MVar13 != 0) {
    lVar16 = 0;
    do {
      dVar1 = *(double *)(uVar10 + lVar16 * 8);
      if ((dVar1 != (double)(int)dVar1) || (NAN(dVar1) || NAN((double)(int)dVar1))) {
        uVar15 = *(uint *)(uVar10 + lVar16 * 8);
        pcVar6 = lj_strfmt_wuleb128(pcVar6,(uVar15 & 0x80000000 | uVar15 * 2) + 1);
        iVar9 = *(int *)(uVar10 + lVar16 * 8);
        if (iVar9 < 0) {
          pcVar6[-1] = (byte)((uint)iVar9 >> 0x1b) & 0x18 | pcVar6[-1] & 7U;
        }
        pcVar6 = lj_strfmt_wuleb128(pcVar6,*(uint32_t *)(uVar10 + 4 + lVar16 * 8));
      }
      else {
        uVar15 = (uint)dVar1;
        pcVar6 = lj_strfmt_wuleb128(pcVar6,uVar15 & 0x80000000 | uVar15 * 2);
        if ((int)uVar15 < 0) {
          pcVar6[-1] = (byte)(uVar15 >> 0x1b) & 0x18 | pcVar6[-1] & 7U;
        }
      }
      lVar16 = lVar16 + 1;
    } while (MVar13 != (MSize)lVar16);
  }
  (ctx->sb).p.ptr32 = (uint32_t)pcVar6;
  if (local_4c != 0) {
    if ((ctx->sb).e.ptr32 - (uint32_t)pcVar6 < local_4c) {
      pcVar6 = lj_buf_more2(&ctx->sb,local_4c);
    }
    else {
      pcVar6 = (char *)((ulong)pcVar6 & 0xffffffff);
    }
    memcpy(pcVar6,(void *)(ulong)(pt->lineinfo).ptr32,(ulong)local_4c);
    (ctx->sb).p.ptr32 = (int)pcVar6 + local_4c;
  }
  if (ctx->status == 0) {
    uVar8 = (ctx->sb).b.ptr32;
    iVar9 = (ctx->sb).p.ptr32 - uVar8;
    uVar15 = iVar9 - 5;
    uVar11 = 0x1f;
    if (uVar15 != 0) {
      for (; uVar15 >> uVar11 == 0; uVar11 = uVar11 - 1) {
      }
    }
    pcVar6 = (char *)((ulong)(5 - ((uVar11 ^ 0xffffffe0) * 9 + 0x168 >> 6)) + (ulong)uVar8);
    lj_strfmt_wuleb128(pcVar6,uVar15);
    iVar9 = (*ctx->wfunc)((lua_State *)(ctx->sb).L.ptr32,pcVar6,(long)iVar9 + 0xfffffffb,ctx->wdata)
    ;
    ctx->status = iVar9;
  }
  return;
}

Assistant:

static void bcwrite_proto(BCWriteCtx *ctx, GCproto *pt)
{
  MSize sizedbg = 0;
  char *p;

  /* Recursively write children of prototype. */
  if ((pt->flags & PROTO_CHILD)) {
    ptrdiff_t i, n = pt->sizekgc;
    GCRef *kr = mref(pt->k, GCRef) - 1;
    for (i = 0; i < n; i++, kr--) {
      GCobj *o = gcref(*kr);
      if (o->gch.gct == ~LJ_TPROTO)
	bcwrite_proto(ctx, gco2pt(o));
    }
  }

  /* Start writing the prototype info to a buffer. */
  p = lj_buf_need(&ctx->sb,
		  5+4+6*5+(pt->sizebc-1)*(MSize)sizeof(BCIns)+pt->sizeuv*2);
  p += 5;  /* Leave room for final size. */

  /* Write prototype header. */
  *p++ = (pt->flags & (PROTO_CHILD|PROTO_VARARG|PROTO_FFI));
  *p++ = pt->numparams;
  *p++ = pt->framesize;
  *p++ = pt->sizeuv;
  p = lj_strfmt_wuleb128(p, pt->sizekgc);
  p = lj_strfmt_wuleb128(p, pt->sizekn);
  p = lj_strfmt_wuleb128(p, pt->sizebc-1);
  if (!ctx->strip) {
    if (proto_lineinfo(pt))
      sizedbg = pt->sizept - (MSize)((char *)proto_lineinfo(pt) - (char *)pt);
    p = lj_strfmt_wuleb128(p, sizedbg);
    if (sizedbg) {
      p = lj_strfmt_wuleb128(p, pt->firstline);
      p = lj_strfmt_wuleb128(p, pt->numline);
    }
  }

  /* Write bytecode instructions and upvalue refs. */
  p = bcwrite_bytecode(ctx, p, pt);
  p = lj_buf_wmem(p, proto_uv(pt), pt->sizeuv*2);
  setsbufP(&ctx->sb, p);

  /* Write constants. */
  bcwrite_kgc(ctx, pt);
  bcwrite_knum(ctx, pt);

  /* Write debug info, if not stripped. */
  if (sizedbg) {
    p = lj_buf_more(&ctx->sb, sizedbg);
    p = lj_buf_wmem(p, proto_lineinfo(pt), sizedbg);
    setsbufP(&ctx->sb, p);
  }

  /* Pass buffer to writer function. */
  if (ctx->status == 0) {
    MSize n = sbuflen(&ctx->sb) - 5;
    MSize nn = (lj_fls(n)+8)*9 >> 6;
    char *q = sbufB(&ctx->sb) + (5 - nn);
    p = lj_strfmt_wuleb128(q, n);  /* Fill in final size. */
    lj_assertBCW(p == sbufB(&ctx->sb) + 5, "bad ULEB128 write");
    ctx->status = ctx->wfunc(sbufL(&ctx->sb), q, nn+n, ctx->wdata);
  }
}